

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::CodedStreamTest_VarintSize32PowersOfTwo_Test::TestBody
          (CodedStreamTest_VarintSize32PowersOfTwo_Test *this)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  byte bVar4;
  pointer *__ptr;
  uint uVar5;
  char *message;
  int expected;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  int local_4c;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  AssertHelper local_38;
  
  local_4c = 1;
  uVar5 = 1;
  do {
    cVar3 = (char)((uVar5 & 0xff) * 0x25 >> 8);
    bVar4 = (byte)uVar5;
    if ((byte)(((byte)(((byte)(bVar4 - cVar3) >> 1) + cVar3) >> 2) * -7 + bVar4) == '\0') {
      local_4c = local_4c + 1;
    }
    uVar2 = (1 << (bVar4 & 0x1f)) + 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (ulong)(iVar1 * 9 + 0x49U >> 6);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"expected",
               "CodedOutputStream::VarintSize32( static_cast<uint32_t>(0x1u << i))",&local_4c,
               (unsigned_long *)&local_58);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      message = anon_var_dwarf_a22956 + 5;
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (local_40->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,500,message);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x20);
  return;
}

Assistant:

TEST_F(CodedStreamTest, VarintSize32PowersOfTwo) {
  int expected = 1;
  for (int i = 1; i < 32; i++) {
    if (i % 7 == 0) {
      expected += 1;
    }
    EXPECT_EQ(expected, CodedOutputStream::VarintSize32(
                            static_cast<uint32_t>(0x1u << i)));
  }
}